

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O0

void mergesort_4way_unstable(uchar **strings,size_t n,uchar **tmp)

{
  ulong n_00;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  size_t split2;
  size_t split1;
  size_t split0;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,0);
  }
  else {
    n_00 = n >> 2;
    uVar1 = n >> 1;
    auVar4._8_4_ = (int)(n >> 0x20);
    auVar4._0_8_ = n;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.75;
    uVar2 = (ulong)dVar3;
    uVar2 = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    mergesort_4way_unstable(strings,n_00,tmp);
    mergesort_4way_unstable(strings + n_00,uVar1 - n_00,tmp);
    mergesort_4way_unstable(strings + uVar1,uVar2 - uVar1,tmp);
    mergesort_4way_unstable(strings + uVar2,n - uVar2,tmp);
    merge_4way_unstable(strings,n_00,strings + n_00,uVar1 - n_00,strings + uVar1,uVar2 - uVar1,
                        strings + uVar2,n - uVar2,tmp);
    memcpy(strings,tmp,n << 3);
  }
  return;
}

Assistant:

void
mergesort_4way_unstable(unsigned char** strings, size_t n, unsigned char** tmp)
{
	//debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = size_t(0.75*n);
	mergesort_4way_unstable(strings,        split0,        tmp);
	mergesort_4way_unstable(strings+split0, split1-split0, tmp);
	mergesort_4way_unstable(strings+split1, split2-split1, tmp);
	mergesort_4way_unstable(strings+split2, n-split2,      tmp);
	merge_4way_unstable(strings,        split0,
	                    strings+split0, split1-split0,
	                    strings+split1, split2-split1,
	                    strings+split2, n-split2,
	                    tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}